

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

TypeFunction * __thiscall
ExpressionContext::GetFunctionType
          (ExpressionContext *this,SynBase *source,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  uint uVar1;
  TypeBase *pTVar2;
  TypeFunction **ppTVar3;
  TypeBase **ppTVar4;
  int iVar5;
  TypeFunction *pTVar6;
  undefined4 extraout_var;
  TypeHandle *pTVar7;
  char *__function;
  uint hash;
  InplaceStr name;
  
  pTVar7 = arguments.head;
  if (returnType != (TypeBase *)0x0) {
    if (returnType->typeID == 0x1b) {
LAB_001e00ef:
      __assert_fail("!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x74d,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                   );
    }
    if (returnType != (TypeBase *)0x0) {
      if (returnType->typeID == 0x1c) goto LAB_001e00ef;
      if (returnType != (TypeBase *)0x0) {
        if (returnType->typeID == 0x1a) goto LAB_001e00ef;
        if ((returnType != (TypeBase *)0x0) && (returnType->typeID == 0)) {
          __assert_fail("!isType<TypeError>(returnType)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x74e,
                        "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                       );
        }
      }
    }
  }
  hash = returnType->nameHash;
  if (pTVar7 != (TypeHandle *)0x0) {
    do {
      pTVar2 = pTVar7->type;
      if (pTVar2 != (TypeBase *)0x0) {
        if (pTVar2->typeID == 0x1b) {
LAB_001e0092:
          __assert_fail("!isType<TypeArgumentSet>(curr->type) && !isType<TypeMemberSet>(curr->type) && !isType<TypeFunctionSet>(curr->type)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x754,
                        "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                       );
        }
        if (pTVar2 != (TypeBase *)0x0) {
          if (pTVar2->typeID == 0x1c) goto LAB_001e0092;
          if (pTVar2 != (TypeBase *)0x0) {
            if (pTVar2->typeID == 0x1a) goto LAB_001e0092;
            if ((pTVar2 != (TypeBase *)0x0) && (pTVar2->typeID == 0)) {
              __assert_fail("!isType<TypeError>(curr->type)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x755,
                            "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                           );
            }
          }
        }
      }
      if (pTVar2 == this->typeAuto) {
        __assert_fail("curr->type != typeAuto",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x758,
                      "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                     );
      }
      hash = hash * 3 + pTVar2->nameHash;
      pTVar7 = pTVar7->next;
    } while (pTVar7 != (TypeHandle *)0x0);
  }
  pTVar6 = GetFunctionTypeFromCache(&this->functionTypeMap,hash,returnType,arguments);
  if (pTVar6 != (TypeFunction *)0x0) {
    return pTVar6;
  }
  iVar5 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x78);
  pTVar6 = (TypeFunction *)CONCAT44(extraout_var,iVar5);
  name = GetFunctionTypeName(this,returnType,arguments);
  TypeFunction::TypeFunction(pTVar6,name,returnType,arguments);
  if ((uint)(*(int *)&(pTVar6->super_TypeBase).name.end -
            *(int *)&(pTVar6->super_TypeBase).name.begin) < 0x2001) {
    (pTVar6->super_TypeBase).alignment = 4;
    uVar1 = (this->functionTypes).count;
    if (uVar1 == (this->functionTypes).max) {
      SmallArray<TypeFunction_*,_128U>::grow(&this->functionTypes,uVar1);
    }
    ppTVar3 = (this->functionTypes).data;
    if (ppTVar3 != (TypeFunction **)0x0) {
      uVar1 = (this->functionTypes).count;
      (this->functionTypes).count = uVar1 + 1;
      ppTVar3[uVar1] = pTVar6;
      uVar1 = (this->types).count;
      if (uVar1 == (this->types).max) {
        SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar1);
      }
      ppTVar4 = (this->types).data;
      if (ppTVar4 != (TypeBase **)0x0) {
        uVar1 = (this->types).count;
        (this->types).count = uVar1 + 1;
        ppTVar4[uVar1] = (TypeBase *)pTVar6;
        DirectChainedMap<TypeFunction_*>::insert(&this->functionTypeMap,hash,pTVar6);
        return pTVar6;
      }
      __function = 
      "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]";
      goto LAB_001e0155;
    }
  }
  else {
    Stop(this,source,"ERROR: generated function type name exceeds maximum type length \'%d\'",0x2000
        );
  }
  __function = 
  "void SmallArray<TypeFunction *, 128>::push_back(const T &) [T = TypeFunction *, N = 128]";
LAB_001e0155:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

TypeFunction* ExpressionContext::GetFunctionType(SynBase *source, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType));
	assert(!isType<TypeError>(returnType));

	unsigned hash = returnType->nameHash;

	for(TypeHandle *curr = arguments.head; curr; curr = curr->next)
	{
		assert(!isType<TypeArgumentSet>(curr->type) && !isType<TypeMemberSet>(curr->type) && !isType<TypeFunctionSet>(curr->type));
		assert(!isType<TypeError>(curr->type));

		// Can't have auto as argument
		assert(curr->type != typeAuto);

		hash = (hash << 1) + hash + curr->type->nameHash;
	}

	if(TypeFunction *prev = GetFunctionTypeFromCache(functionTypeMap, hash, returnType, arguments))
		return prev;

	// Create new type
	TypeFunction* result = new (get<TypeFunction>()) TypeFunction(GetFunctionTypeName(*this, returnType, arguments), returnType, arguments);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated function type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	result->alignment = 4;

	functionTypes.push_back(result);
	types.push_back(result);

	functionTypeMap.insert(hash, result);

	return result;
}